

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

int co_accept(int fd,sockaddr *addr,socklen_t *len)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  rpchook_t *prVar4;
  
  if (g_sys_fcntl_func == (fcntl_pfn_t)0x0) {
    g_sys_fcntl_func = (fcntl_pfn_t)dlsym(0xffffffffffffffff,"fcntl");
  }
  uVar1 = accept(fd,(sockaddr *)addr,len);
  if (-1 < (int)uVar1) {
    if ((int)uVar1 < 1000000) {
      prVar4 = (rpchook_t *)calloc(1,0x38);
      (prVar4->read_timeout).tv_sec = 0x28;
      (prVar4->write_timeout).tv_sec = 10;
      g_rpchook_socket_fd[uVar1] = prVar4;
    }
    else {
      prVar4 = (rpchook_t *)0x0;
    }
    uVar2 = (*g_sys_fcntl_func)(uVar1,3,0);
    iVar3 = (*g_sys_fcntl_func)(uVar1,4,(ulong)(uVar2 | 0x800));
    if ((prVar4 != (rpchook_t *)0x0) && (iVar3 == 0)) {
      prVar4->user_flag = uVar2;
    }
  }
  return uVar1;
}

Assistant:

int co_accept( int fd, struct sockaddr *addr, socklen_t *len )
{
	HOOK_SYS_FUNC( fcntl );

	int cli = accept( fd,addr,len );
	if( cli < 0 )
	{
		return cli;
	}
	rpchook_t *lp = alloc_by_fd( cli );


	int	current_flags = g_sys_fcntl_func( cli ,F_GETFL, 0 );
	int flag = current_flags;
	flag |= O_NONBLOCK;

	int ret = g_sys_fcntl_func( cli ,F_SETFL, flag );
	if( 0 == ret && lp ){
		lp->user_flag = current_flags;
	}
	return cli;
}